

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int RankIsPlausible(pyhanabi_card_knowledge_t *knowledge,int rank)

{
  bool bVar1;
  undefined4 in_ESI;
  long *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,100,"int RankIsPlausible(pyhanabi_card_knowledge_t *, int)");
  }
  if (*in_RDI != 0) {
    bVar1 = hanabi_learning_env::HanabiHand::CardKnowledge::RankPlausible
                      ((CardKnowledge *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffec);
    return (int)bVar1;
  }
  __assert_fail("knowledge->knowledge != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x65,"int RankIsPlausible(pyhanabi_card_knowledge_t *, int)");
}

Assistant:

int RankIsPlausible(pyhanabi_card_knowledge_t* knowledge, int rank) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->RankPlausible(rank);
}